

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_ep_dial_cb(void *arg)

{
  nng_stream *conn_00;
  nng_stream *conn;
  ipc_pipe *piStack_30;
  int rv;
  ipc_pipe *p;
  nni_aio *uaio;
  nni_aio *aio;
  ipc_ep *ep;
  void *arg_local;
  
  uaio = (nni_aio *)((long)arg + 0x60);
  aio = (nni_aio *)arg;
  ep = (ipc_ep *)arg;
  nni_mtx_lock((nni_mtx *)arg);
  conn._4_4_ = nni_aio_result(uaio);
  if (conn._4_4_ == NNG_OK) {
    conn_00 = (nng_stream *)nni_aio_get_output(uaio,0);
    if (((ulong)(aio->a_task).task_arg & 0x1000000) == 0) {
      conn._4_4_ = nni_pipe_alloc_dialer
                             (&stack0xffffffffffffffd0,
                              (nni_dialer *)(aio->a_task).task_mtx.mtx.__align);
      if (conn._4_4_ == NNG_OK) {
        ipc_pipe_start(piStack_30,conn_00,(ipc_ep *)aio);
        nni_mtx_unlock((nni_mtx *)aio);
        return;
      }
      nng_stream_free(conn_00);
    }
    else {
      nng_stream_free(conn_00);
      conn._4_4_ = NNG_ECLOSED;
    }
  }
  p = *(ipc_pipe **)((long)&(aio->a_task).task_mtx.mtx + 8);
  if (p != (ipc_pipe *)0x0) {
    *(undefined8 *)((long)&(aio->a_task).task_mtx.mtx + 8) = 0;
    nni_aio_finish_error((nni_aio *)p,conn._4_4_);
  }
  nni_mtx_unlock((nni_mtx *)aio);
  return;
}

Assistant:

static void
ipc_ep_dial_cb(void *arg)
{
	ipc_ep     *ep  = arg;
	nni_aio    *aio = &ep->conn_aio;
	nni_aio    *uaio;
	ipc_pipe   *p;
	int         rv;
	nng_stream *conn;

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_pipe_alloc_dialer((void **) &p, ep->ndialer)) != 0) {
		nng_stream_free(conn);
		goto error;
	}

	ipc_pipe_start(p, conn, ep);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// Error connecting.  We need to pass this straight back
	// to the user.
	if ((uaio = ep->user_aio) != NULL) {
		ep->user_aio = NULL;
		nni_aio_finish_error(uaio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
}